

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  VtabCtx *pVVar1;
  Table *pTVar2;
  int iVar3;
  Index *pIVar4;
  char *pcVar5;
  Index *pIdx;
  Table *pNew;
  Parse sParse;
  char *zErr;
  Table *pTab;
  int rc;
  VtabCtx *pCtx;
  char *zCreateTable_local;
  sqlite3 *db_local;
  
  pTab._4_4_ = 0;
  sParse.pRename = (RenameToken *)0x0;
  sqlite3_mutex_enter(db->mutex);
  pVVar1 = db->pVtabCtx;
  if ((pVVar1 == (VtabCtx *)0x0) || (pVVar1->bDeclared != 0)) {
    sqlite3Error(db,0x15);
    sqlite3_mutex_leave(db->mutex);
    db_local._4_4_ = sqlite3MisuseError(0x20f90);
  }
  else {
    pTVar2 = pVVar1->pTab;
    memset(&pNew,0,0x1a0);
    sParse.sLastToken._12_1_ = 1;
    sParse.pParentParse._4_4_ = 1;
    pNew = (Table *)db;
    iVar3 = sqlite3RunParser((Parse *)&pNew,zCreateTable,(char **)&sParse.pRename);
    pcVar5 = sParse.zTail;
    if ((((iVar3 == 0) && (sParse.zTail != (char *)0x0)) && (db->mallocFailed == '\0')) &&
       ((*(long *)(sParse.zTail + 0x18) == 0 && (*(int *)(sParse.zTail + 0x54) == 0)))) {
      if (pTVar2->aCol == (Column *)0x0) {
        pTVar2->aCol = *(Column **)(sParse.zTail + 8);
        pTVar2->nCol = *(i16 *)(sParse.zTail + 0x46);
        pTVar2->tabFlags = *(uint *)(sParse.zTail + 0x40) & 0x60 | pTVar2->tabFlags;
        pcVar5[0x46] = '\0';
        pcVar5[0x47] = '\0';
        pcVar5[8] = '\0';
        pcVar5[9] = '\0';
        pcVar5[10] = '\0';
        pcVar5[0xb] = '\0';
        pcVar5[0xc] = '\0';
        pcVar5[0xd] = '\0';
        pcVar5[0xe] = '\0';
        pcVar5[0xf] = '\0';
        if ((((*(uint *)(sParse.zTail + 0x40) & 0x20) != 0) &&
            (pVVar1->pVTable->pMod->pModule->xUpdate !=
             (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)) &&
           (pIVar4 = sqlite3PrimaryKeyIndex((Table *)sParse.zTail), pIVar4->nKeyCol != 1)) {
          pTab._4_4_ = 1;
        }
        pIVar4 = *(Index **)(pcVar5 + 0x10);
        if (pIVar4 != (Index *)0x0) {
          pTVar2->pIndex = pIVar4;
          pcVar5[0x10] = '\0';
          pcVar5[0x11] = '\0';
          pcVar5[0x12] = '\0';
          pcVar5[0x13] = '\0';
          pcVar5[0x14] = '\0';
          pcVar5[0x15] = '\0';
          pcVar5[0x16] = '\0';
          pcVar5[0x17] = '\0';
          pIVar4->pTable = pTVar2;
        }
      }
      pVVar1->bDeclared = 1;
    }
    else {
      pcVar5 = (char *)0x0;
      if (sParse.pRename != (RenameToken *)0x0) {
        pcVar5 = "%s";
      }
      sqlite3ErrorWithMsg(db,1,pcVar5,sParse.pRename);
      sqlite3DbFree(db,sParse.pRename);
      pTab._4_4_ = 1;
    }
    sParse.sLastToken._12_1_ = 0;
    if (sParse.zErrMsg != (char *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)sParse.zErrMsg);
    }
    sqlite3DeleteTable(db,(Table *)sParse.zTail);
    sqlite3ParserReset((Parse *)&pNew);
    db_local._4_4_ = sqlite3ApiExit(db,pTab._4_4_);
    sqlite3_mutex_leave(db->mutex);
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  int rc = SQLITE_OK;
  Table *pTab;
  char *zErr = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }
  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  memset(&sParse, 0, sizeof(sParse));
  sParse.eParseMode = PARSE_MODE_DECLARE_VTAB;
  sParse.db = db;
  sParse.nQueryLoop = 1;
  if( SQLITE_OK==sqlite3RunParser(&sParse, zCreateTable, &zErr) 
   && sParse.pNewTable
   && !db->mallocFailed
   && !sParse.pNewTable->pSelect
   && !IsVirtual(sParse.pNewTable)
  ){
    if( !pTab->aCol ){
      Table *pNew = sParse.pNewTable;
      Index *pIdx;
      pTab->aCol = pNew->aCol;
      pTab->nCol = pNew->nCol;
      pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
      pNew->nCol = 0;
      pNew->aCol = 0;
      assert( pTab->pIndex==0 );
      assert( HasRowid(pNew) || sqlite3PrimaryKeyIndex(pNew)!=0 );
      if( !HasRowid(pNew)
       && pCtx->pVTable->pMod->pModule->xUpdate!=0
       && sqlite3PrimaryKeyIndex(pNew)->nKeyCol!=1
      ){
        /* WITHOUT ROWID virtual tables must either be read-only (xUpdate==0)
        ** or else must have a single-column PRIMARY KEY */
        rc = SQLITE_ERROR;
      }
      pIdx = pNew->pIndex;
      if( pIdx ){
        assert( pIdx->pNext==0 );
        pTab->pIndex = pIdx;
        pNew->pIndex = 0;
        pIdx->pTable = pTab;
      }
    }
    pCtx->bDeclared = 1;
  }else{
    sqlite3ErrorWithMsg(db, SQLITE_ERROR, (zErr ? "%s" : 0), zErr);
    sqlite3DbFree(db, zErr);
    rc = SQLITE_ERROR;
  }
  sParse.eParseMode = PARSE_MODE_NORMAL;

  if( sParse.pVdbe ){
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  sqlite3DeleteTable(db, sParse.pNewTable);
  sqlite3ParserReset(&sParse);

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}